

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O0

SampledSpectrum __thiscall
pbrt::LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::f
          (LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true> *this,Vector3f wo,
          Vector3f wi,TransportMode mode)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  Vector3f w_00;
  Vector3f w_01;
  Vector3f w_02;
  Vector3f w_03;
  Vector3f w_04;
  undefined1 auVar3 [16];
  Vector3f w_05;
  Vector3f w_06;
  Vector3f w_07;
  Vector3f w_08;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Vector3<float> args;
  Vector3f wi_00;
  undefined1 auVar7 [16];
  Vector3f wi_01;
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f wo_02;
  Vector3f wo_03;
  Vector3f wo_04;
  Vector3f wo_05;
  Vector3f wo_06;
  undefined1 auVar8 [16];
  Vector3f wi_02;
  Vector3f wi_03;
  Vector3f wi_04;
  Vector3f wi_05;
  undefined1 auVar9 [16];
  Vector3f wi_06;
  Vector3f wi_07;
  Vector3f wi_08;
  Vector3f wo_07;
  Vector3f wo_08;
  Vector3f wo_09;
  Vector3f wo_10;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  Vector3f wp;
  Vector3f w_09;
  Vector3f wp_00;
  Vector3f w_10;
  Vector3f wp_01;
  Vector3f w_11;
  array<float,_4> aVar70;
  bool bVar71;
  BSDFSample *pBVar72;
  float *pfVar73;
  PhaseFunctionSample *pPVar74;
  TransportMode in_ESI;
  int __x;
  DielectricBxDF *in_RDI;
  Float FVar75;
  float fVar76;
  undefined8 uVar84;
  undefined1 in_ZMM0 [64];
  undefined1 auVar88 [56];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined8 uVar85;
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> *pTVar86;
  HGPhaseFunction *pHVar87;
  SampledSpectrum *this_00;
  undefined1 auVar83 [64];
  float in_XMM1_Da;
  undefined1 auVar95 [56];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 in_ZMM2 [64];
  float in_XMM3_Da;
  SampledSpectrum SVar96;
  Vector3<float> VVar97;
  Float exitPDF_1;
  Float wt_3;
  SampledSpectrum fExit_1;
  optional<pbrt::BSDFSample> bs_1;
  Point2f u_1;
  Float uc_2;
  Float wt_2;
  optional<pbrt::BSDFSample> bs;
  Float uc_1;
  Float wt_1;
  Float exitPDF;
  SampledSpectrum fExit;
  optional<pbrt::PhaseFunctionSample> ps;
  Point2f u;
  Float wt;
  Float zp;
  Float dz;
  Float sigma_t;
  Float q;
  int depth;
  HGPhaseFunction phase;
  Vector3f w;
  Float z;
  SampledSpectrum beta;
  optional<pbrt::BSDFSample> wis;
  optional<pbrt::BSDFSample> wos;
  Float uc;
  int s;
  anon_class_8_1_ba1d750b r;
  RNG rng;
  Float exitZ;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> nonExitInterface;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> exitInterface;
  bool enteredTop;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> enterInterface;
  SampledSpectrum f;
  float in_stack_ffffffffffffed08;
  float in_stack_ffffffffffffed0c;
  undefined4 in_stack_ffffffffffffed10;
  Float in_stack_ffffffffffffed14;
  float in_stack_ffffffffffffed18;
  float in_stack_ffffffffffffed1c;
  float in_stack_ffffffffffffed20;
  float in_stack_ffffffffffffed24;
  undefined4 in_stack_ffffffffffffed40;
  int in_stack_ffffffffffffed44;
  HGPhaseFunction *in_stack_ffffffffffffed50;
  undefined8 in_stack_ffffffffffffed58;
  float in_stack_ffffffffffffed60;
  BxDFReflTransFlags in_stack_ffffffffffffed64;
  TransportMode in_stack_ffffffffffffed68;
  Float in_stack_ffffffffffffed6c;
  float in_stack_ffffffffffffed70;
  Float in_stack_ffffffffffffed74;
  Tuple2<pbrt::Point2,_float> in_stack_ffffffffffffed78;
  float in_stack_ffffffffffffed80;
  undefined4 in_stack_ffffffffffffed88;
  TransportMode in_stack_ffffffffffffed8c;
  float in_stack_ffffffffffffed90;
  float in_stack_ffffffffffffed94;
  float in_stack_ffffffffffffed98;
  float in_stack_ffffffffffffed9c;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> *in_stack_ffffffffffffeda0;
  undefined4 in_stack_ffffffffffffedac;
  BxDFFlags in_stack_ffffffffffffedb0;
  float in_stack_ffffffffffffedb4;
  float in_stack_ffffffffffffedbc;
  undefined8 in_stack_ffffffffffffedc0;
  undefined8 in_stack_ffffffffffffedc8;
  float in_stack_ffffffffffffedd0;
  undefined4 uStack_122c;
  Tuple3<pbrt::Vector3,_float> in_stack_ffffffffffffedd8;
  float local_b7c;
  Float local_b64;
  Float local_b3c;
  Float local_a44;
  optional local_8bc [56];
  float local_884;
  undefined8 local_880;
  float local_878;
  undefined8 local_870;
  float local_868;
  undefined8 local_860;
  float local_858;
  undefined8 local_850;
  float local_848;
  undefined8 local_840;
  float local_838;
  undefined8 local_830;
  float local_828;
  undefined8 local_820;
  float local_818;
  undefined8 local_810;
  float local_808;
  undefined8 local_800;
  float local_7f8;
  undefined8 local_7f0;
  float local_7e8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  undefined8 local_7d0;
  undefined8 local_7c8;
  undefined8 local_7c0;
  undefined8 local_7b8;
  undefined8 local_7b0;
  undefined8 local_7a8;
  undefined8 local_7a0;
  undefined8 local_798;
  undefined8 local_790;
  undefined8 local_788;
  undefined8 local_780;
  undefined8 local_778;
  undefined8 local_770;
  float local_768;
  undefined8 local_760;
  float local_758;
  undefined8 local_750;
  float local_748;
  undefined8 local_740;
  float local_738;
  undefined8 local_730;
  float local_728;
  undefined8 local_720;
  float local_718;
  Float local_714;
  undefined8 local_710;
  float local_708;
  undefined8 local_700;
  float local_6f8;
  undefined8 local_6f0;
  undefined8 local_6e8;
  undefined8 local_6e0;
  undefined8 local_6d8;
  ulong local_6d0;
  float local_6c8;
  ulong local_6b8;
  float local_6b0;
  ulong local_6a8;
  float local_6a0;
  optional local_69c [48];
  float local_66c;
  undefined8 local_668;
  float local_660;
  undefined8 local_658;
  float local_650;
  undefined8 local_64c;
  undefined8 local_644;
  undefined8 local_63c;
  undefined8 local_634;
  undefined8 local_62c;
  undefined8 local_624;
  Float local_61c;
  ulong local_618;
  float local_610;
  undefined8 local_608;
  float local_600;
  ulong local_5f8;
  float local_5f0;
  undefined8 local_5e8;
  float local_5e0;
  undefined8 local_5d8;
  float local_5d0;
  Float local_5cc;
  ulong local_5c8;
  float local_5c0;
  undefined8 local_5b8;
  float local_5b0;
  ulong local_5a8;
  float local_5a0;
  undefined8 local_598;
  float local_590;
  undefined8 local_588;
  float local_580;
  undefined8 local_578;
  undefined8 local_570;
  undefined8 local_568;
  undefined8 local_560;
  undefined8 local_558;
  undefined8 local_550;
  ulong local_548;
  float local_540;
  undefined8 local_538;
  ulong local_530;
  float local_528;
  ulong local_520;
  float local_518;
  optional local_510 [24];
  undefined8 local_4f8;
  undefined8 local_4f0;
  float local_4e8;
  undefined8 local_4e0;
  float local_4d8;
  undefined8 local_4d0;
  float local_4c8;
  undefined8 local_4c0;
  float local_4b8;
  undefined8 local_4b0;
  float local_4a8;
  undefined8 local_4a0;
  float local_498;
  undefined8 local_490;
  float local_488;
  undefined8 local_480;
  float local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined8 local_428;
  undefined8 local_420;
  undefined8 local_418;
  undefined8 local_410;
  float local_408;
  undefined8 local_400;
  float local_3f8;
  undefined8 local_3f0;
  float local_3e8;
  undefined8 local_3e0;
  float local_3d8;
  undefined8 local_3d0;
  float local_3c8;
  undefined8 local_3c0;
  float local_3b8;
  Float local_3b0;
  float local_3ac;
  Float local_3a8;
  undefined4 local_3a4;
  undefined8 local_3a0;
  float local_398;
  undefined8 local_390;
  float local_388;
  float local_384;
  float local_380;
  float local_37c;
  int local_378;
  HGPhaseFunction local_374;
  undefined8 local_370;
  float local_368;
  Float local_364;
  undefined8 local_360;
  float local_358;
  undefined8 local_350;
  float local_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  ulong local_320;
  float local_318;
  ulong local_308;
  float local_300;
  optional local_2f8 [48];
  int local_2c8;
  ulong local_2b8;
  float local_2b0;
  ulong local_2a0;
  float local_298;
  optional local_290 [48];
  float local_260;
  int local_25c;
  undefined1 *local_258;
  ulong local_250;
  float local_248;
  ulong local_240;
  float local_238;
  ulong local_230;
  float local_228;
  ulong local_220;
  float local_218;
  undefined1 local_210 [16];
  ulong local_200;
  float local_1f8;
  ulong local_1f0;
  float local_1e8;
  ulong local_1e0;
  float local_1d8;
  ulong local_1d0;
  float local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  ulong local_1a0;
  float local_198;
  ulong local_190;
  float local_188;
  ulong local_180;
  float local_178;
  ulong local_170;
  float local_168;
  ulong local_160;
  float local_158;
  ulong local_150;
  float local_148;
  ulong local_140;
  float local_138;
  ulong local_130;
  float local_128;
  Float local_124;
  ulong local_120;
  float local_118;
  ulong local_110;
  float local_108;
  ulong local_100;
  float local_f8;
  ulong local_f0;
  float local_e8;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> local_e0;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> local_d0;
  byte local_b9;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> local_b8;
  ulong local_a8;
  float local_a0;
  ulong local_94;
  float local_8c;
  ulong local_88;
  float local_80;
  ulong local_78;
  float local_70;
  undefined8 local_6c;
  undefined8 local_64;
  TransportMode local_5c;
  ulong local_4c;
  ulong local_3c;
  float local_34;
  ulong local_30;
  ulong local_20;
  float local_18;
  
  local_30 = vmovlpd_avx(in_ZMM0._0_16_);
  local_4c = vmovlpd_avx(in_ZMM2._0_16_);
  local_5c = in_ESI;
  local_3c = local_4c;
  local_34 = in_XMM3_Da;
  local_20 = local_30;
  local_18 = in_XMM1_Da;
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
             in_stack_ffffffffffffed0c);
  auVar88 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  if (local_18 < 0.0) {
    VVar97 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
    local_80 = VVar97.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar79._0_8_ = VVar97.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar79._8_56_ = auVar88;
    local_88 = vmovlpd_avx(auVar79._0_16_);
    local_78 = local_88;
    local_70 = local_80;
    local_20 = local_88;
    local_18 = local_80;
    VVar97 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
    local_a0 = VVar97.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar91._0_8_ = VVar97.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar91._8_56_ = auVar88;
    local_a8 = vmovlpd_avx(auVar91._0_16_);
    local_94 = local_a8;
    local_8c = local_a0;
    local_3c = local_a8;
    local_34 = local_a0;
  }
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::TopOrBottomBxDF(&local_b8);
  local_b9 = 1;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::operator=(&local_b8,in_RDI);
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::TopOrBottomBxDF(&local_d0);
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::TopOrBottomBxDF(&local_e0);
  local_e8 = local_18;
  local_f0 = local_20;
  local_f8 = local_34;
  local_100 = local_3c;
  local_108 = local_18;
  local_110 = local_20;
  w_11.super_Tuple3<pbrt::Vector3,_float>.z = local_18;
  w_11.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_20;
  w_11.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_20._4_4_;
  local_118 = local_34;
  local_120 = local_3c;
  wp_01.super_Tuple3<pbrt::Vector3,_float>.z = local_34;
  wp_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_3c;
  wp_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_3c._4_4_;
  bVar71 = SameHemisphere(w_11,wp_01);
  if (bVar71 == (bool)(local_b9 & 1)) {
    TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::operator=(&local_d0,in_RDI);
    TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::operator=
              (&local_e0,(ConductorBxDF *)(in_RDI + 1));
  }
  else {
    TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::operator=
              (&local_d0,(ConductorBxDF *)(in_RDI + 1));
    TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::operator=(&local_e0,in_RDI);
  }
  local_128 = local_18;
  local_130 = local_20;
  local_138 = local_34;
  local_140 = local_3c;
  local_148 = local_18;
  local_150 = local_20;
  w_10.super_Tuple3<pbrt::Vector3,_float>.z = local_18;
  w_10.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_20;
  w_10.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_20._4_4_;
  local_158 = local_34;
  local_160 = local_3c;
  wp_00.super_Tuple3<pbrt::Vector3,_float>.z = local_34;
  wp_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_3c;
  wp_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_3c._4_4_;
  bVar71 = SameHemisphere(w_10,wp_00);
  if (bVar71 == (bool)(local_b9 & 1)) {
    local_a44 = in_RDI[4].mfDistrib.alpha_x;
  }
  else {
    local_a44 = 0.0;
  }
  local_124 = local_a44;
  local_168 = local_18;
  local_170 = local_20;
  local_178 = local_34;
  local_180 = local_3c;
  local_188 = local_18;
  local_190 = local_20;
  w_09.super_Tuple3<pbrt::Vector3,_float>.z = local_18;
  w_09.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_20;
  w_09.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_20._4_4_;
  local_198 = local_34;
  local_1a0 = local_3c;
  wp.super_Tuple3<pbrt::Vector3,_float>.z = local_34;
  wp.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_3c;
  wp.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_3c._4_4_;
  bVar71 = SameHemisphere(w_09,wp);
  if (bVar71) {
    local_1c8 = local_18;
    local_1d0 = local_20;
    local_1d8 = local_34;
    local_1e0 = local_3c;
    local_1e8 = local_18;
    local_1f0 = local_20;
    auVar88 = ZEXT856(0);
    auVar95 = (undefined1  [56])0x0;
    local_1f8 = local_34;
    local_200 = local_3c;
    wo_07.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffedd0;
    wo_07.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_ffffffffffffedc8;
    wo_07.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)in_stack_ffffffffffffedc8 >> 0x20);
    wi_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_ffffffffffffedb0;
    wi_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_ffffffffffffedac;
    wi_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffedb4;
    SVar96 = TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::f
                       ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> *)
                        CONCAT44(in_stack_ffffffffffffed94,in_stack_ffffffffffffed90),wo_07,wi_02,
                        in_stack_ffffffffffffed8c);
    auVar89._0_8_ = SVar96.values.values._8_8_;
    auVar89._8_56_ = auVar95;
    auVar77._0_8_ = SVar96.values.values._0_8_;
    auVar77._8_56_ = auVar88;
    auVar88 = (undefined1  [56])0x0;
    local_1c0 = vmovlpd_avx(auVar77._0_16_);
    local_1b8 = vmovlpd_avx(auVar89._0_16_);
    SVar96 = pbrt::operator*(in_stack_ffffffffffffed14,
                             (SampledSpectrum *)
                             CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
    auVar90._0_8_ = SVar96.values.values._8_8_;
    auVar90._8_56_ = auVar95;
    auVar78._0_8_ = SVar96.values.values._0_8_;
    auVar78._8_56_ = auVar88;
    local_1b0 = vmovlpd_avx(auVar78._0_16_);
    local_1a8 = vmovlpd_avx(auVar90._0_16_);
    local_6c = local_1b0;
    local_64 = local_1a8;
  }
  GetOptions();
  local_218 = local_18;
  local_220 = local_20;
  local_228 = local_18;
  local_230 = local_20;
  VVar97.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed60;
  VVar97.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_ffffffffffffed58;
  VVar97.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)in_stack_ffffffffffffed58 >> 0x20);
  Hash<int,pbrt::Vector3<float>>(in_stack_ffffffffffffed44,VVar97);
  local_238 = local_34;
  local_240 = local_3c;
  local_248 = local_34;
  local_250 = local_3c;
  auVar79 = ZEXT864(local_3c);
  auVar91 = ZEXT464(0);
  args.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed60;
  args.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_ffffffffffffed58;
  args.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)in_stack_ffffffffffffed58 >> 0x20)
  ;
  Hash<pbrt::Vector3<float>>(args);
  RNG::RNG((RNG *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
           CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0x7026dd);
  local_258 = local_210;
  local_25c = 0;
  do {
    auVar88 = auVar91._8_56_;
    if ((int)in_RDI[6].mfDistrib.alpha_y <= local_25c) {
      auVar95 = ZEXT856(auVar79._8_8_);
      SVar96 = SampledSpectrum::operator/
                         ((SampledSpectrum *)
                          CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
                          in_stack_ffffffffffffed14);
      auVar94._0_8_ = SVar96.values.values._8_8_;
      auVar94._8_56_ = auVar88;
      auVar83._0_8_ = SVar96.values.values._0_8_;
      auVar83._8_56_ = auVar95;
      uVar84 = vmovlpd_avx(auVar83._0_16_);
      uVar85 = vmovlpd_avx(auVar94._0_16_);
      aVar70.values[2] = (float)(int)uVar85;
      aVar70.values[3] = (float)(int)((ulong)uVar85 >> 0x20);
      aVar70.values[0] = (float)(int)uVar84;
      aVar70.values[1] = (float)(int)((ulong)uVar84 >> 0x20);
      return (array<float,_4>)(array<float,_4>)aVar70.values;
    }
    local_260 = LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::f::
                anon_class_8_1_ba1d750b::operator()
                          ((anon_class_8_1_ba1d750b *)
                           CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
    local_298 = local_18;
    local_2a0 = local_20;
    LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::f::anon_class_8_1_ba1d750b::
    operator()((anon_class_8_1_ba1d750b *)
               CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
    LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::f::anon_class_8_1_ba1d750b::
    operator()((anon_class_8_1_ba1d750b *)
               CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
    Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
               in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08);
    local_2b0 = local_298;
    local_2b8 = local_2a0;
    auVar79 = ZEXT864(local_2a0);
    auVar91 = ZEXT464(0);
    wo_02.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_ffffffffffffed94;
    wo_02.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffed90;
    wo_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed98;
    TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::Sample_f
              ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> *)
               CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),wo_02,
               in_stack_ffffffffffffed6c,(Point2f)in_stack_ffffffffffffed78,
               in_stack_ffffffffffffed68,in_stack_ffffffffffffed64);
    bVar71 = pstd::optional::operator_cast_to_bool(local_290);
    if (bVar71) {
      pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x702839);
      bVar71 = SampledSpectrum::operator_cast_to_bool
                         ((SampledSpectrum *)
                          CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
      if (!bVar71) goto LAB_007028c8;
      pBVar72 = pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x702873)
      ;
      fVar76 = pBVar72->pdf;
      auVar79 = ZEXT464((uint)fVar76);
      auVar91 = ZEXT1664((undefined1  [16])0x0);
      if ((fVar76 == 0.0) && (!NAN(fVar76))) goto LAB_007028c8;
      pBVar72 = pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x7028a5)
      ;
      fVar76 = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar79 = ZEXT464((uint)fVar76);
      auVar91 = ZEXT1664((undefined1  [16])0x0);
      if ((fVar76 == 0.0) && (!NAN(fVar76))) goto LAB_007028c8;
      local_260 = LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::f::
                  anon_class_8_1_ba1d750b::operator()
                            ((anon_class_8_1_ba1d750b *)
                             CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
      local_300 = local_34;
      local_308 = local_3c;
      LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::f::anon_class_8_1_ba1d750b::
      operator()((anon_class_8_1_ba1d750b *)
                 CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
      LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::f::anon_class_8_1_ba1d750b::
      operator()((anon_class_8_1_ba1d750b *)
                 CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
      Point2<float>::Point2
                ((Point2<float> *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
                 in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08);
      operator!(local_5c);
      local_318 = local_300;
      local_320 = local_308;
      auVar79 = ZEXT864(local_308);
      auVar91 = ZEXT464(0);
      wo_03.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_ffffffffffffed94;
      wo_03.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffed90;
      wo_03.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed98;
      TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::Sample_f
                ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> *)
                 CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),wo_03,
                 in_stack_ffffffffffffed6c,(Point2f)in_stack_ffffffffffffed78,
                 in_stack_ffffffffffffed68,in_stack_ffffffffffffed64);
      bVar71 = pstd::optional::operator_cast_to_bool(local_2f8);
      if (bVar71) {
        pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x702a49);
        bVar71 = SampledSpectrum::operator_cast_to_bool
                           ((SampledSpectrum *)
                            CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
        if (!bVar71) goto LAB_00702ad8;
        pBVar72 = pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x702a83);
        fVar76 = pBVar72->pdf;
        auVar79 = ZEXT464((uint)fVar76);
        auVar91 = ZEXT1664((undefined1  [16])0x0);
        if ((fVar76 == 0.0) && (!NAN(fVar76))) goto LAB_00702ad8;
        pBVar72 = pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x702ab5);
        fVar76 = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.z;
        auVar79 = ZEXT464((uint)fVar76);
        auVar91 = ZEXT1664((undefined1  [16])0x0);
        if ((fVar76 == 0.0) && (!NAN(fVar76))) goto LAB_00702ad8;
        pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x702b0e);
        pBVar72 = pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x702b35);
        local_358 = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.z;
        local_360._0_4_ = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.x;
        local_360._4_4_ = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.y;
        uVar85 = 0;
        w_05.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_ffffffffffffed20;
        w_05.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffed1c;
        w_05.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed24;
        local_350 = local_360;
        local_348 = local_358;
        AbsCosTheta(w_05);
        uVar84 = 0;
        SVar96 = SampledSpectrum::operator*
                           ((SampledSpectrum *)
                            CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                            in_stack_ffffffffffffed1c);
        auVar68._8_8_ = uVar85;
        auVar68._0_8_ = SVar96.values.values._8_8_;
        auVar69._8_8_ = uVar84;
        auVar69._0_8_ = SVar96.values.values._0_8_;
        local_340 = vmovlpd_avx(auVar69);
        local_338 = vmovlpd_avx(auVar68);
        pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x702bf8);
        uVar85 = 0;
        SVar96 = SampledSpectrum::operator/
                           ((SampledSpectrum *)
                            CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
                            in_stack_ffffffffffffed14);
        auVar66._8_8_ = uVar84;
        auVar66._0_8_ = SVar96.values.values._8_8_;
        auVar67._8_8_ = uVar85;
        auVar67._0_8_ = SVar96.values.values._0_8_;
        auVar91 = ZEXT1664(auVar67);
        local_330 = vmovlpd_avx(auVar67);
        local_328 = vmovlpd_avx(auVar66);
        if ((local_b9 & 1) == 0) {
          local_b3c = 0.0;
        }
        else {
          local_b3c = in_RDI[4].mfDistrib.alpha_x;
        }
        local_364 = local_b3c;
        pBVar72 = pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x702ca4);
        local_368 = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.z;
        local_370._0_4_ = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.x;
        local_370._4_4_ = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.y;
        FVar75 = in_RDI[4].mfDistrib.alpha_y;
        auVar79 = ZEXT464((uint)FVar75);
        HGPhaseFunction::HGPhaseFunction(&local_374,FVar75);
        for (local_378 = 0; local_378 < (int)in_RDI[6].mfDistrib.alpha_x; local_378 = local_378 + 1)
        {
          if ((3 < local_378) &&
             (FVar75 = SampledSpectrum::MaxComponentValue
                                 ((SampledSpectrum *)
                                  CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10)),
             FVar75 < 0.25)) {
            local_380 = 0.0;
            FVar75 = SampledSpectrum::MaxComponentValue
                               ((SampledSpectrum *)
                                CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
            local_384 = 1.0 - FVar75;
            pfVar73 = std::max<float>(&local_380,&local_384);
            local_37c = *pfVar73;
            fVar76 = LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::f::
                     anon_class_8_1_ba1d750b::operator()
                               ((anon_class_8_1_ba1d750b *)
                                CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
            auVar91 = ZEXT464((uint)fVar76);
            auVar79 = ZEXT464((uint)local_37c);
            if (fVar76 < local_37c) break;
            SampledSpectrum::operator/=
                      ((SampledSpectrum *)
                       CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                       in_stack_ffffffffffffed1c);
          }
          bVar71 = SampledSpectrum::operator_cast_to_bool
                             ((SampledSpectrum *)
                              CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
          if (bVar71) {
            local_3a4 = 0x3f800000;
            __x = (int)&local_258;
            LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::f::anon_class_8_1_ba1d750b
            ::operator()((anon_class_8_1_ba1d750b *)
                         CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
            std::abs(__x);
            local_3a8 = SampleExponential(0.0,1.030264e-38);
            auVar91 = ZEXT1664((undefined1  [16])0x0);
            if (local_368 <= 0.0) {
              local_b7c = local_364 - local_3a8;
            }
            else {
              local_b7c = local_364 + local_3a8;
            }
            local_3ac = local_b7c;
            auVar79 = ZEXT464((uint)local_364);
            if ((local_364 != local_b7c) || (NAN(local_364) || NAN(local_b7c))) {
              if (0.0 < local_b7c) {
                auVar88 = SUB6056((undefined1  [60])0x0,4);
                uVar84 = 0;
                if (local_b7c < in_RDI[4].mfDistrib.alpha_x) {
                  local_3b0 = 1.0;
                  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::Flags
                            ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> *)
                             CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
                  bVar71 = IsSpecular(Unset);
                  if (!bVar71) {
                    pstd::optional<pbrt::BSDFSample>::operator->
                              ((optional<pbrt::BSDFSample> *)0x7030b2);
                    uVar84 = 0;
                    VVar97 = Tuple3<pbrt::Vector3,_float>::operator-
                                       ((Tuple3<pbrt::Vector3,_float> *)
                                        CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10
                                                ));
                    local_3c8 = VVar97.super_Tuple3<pbrt::Vector3,_float>.z;
                    uVar85 = 0;
                    auVar65._8_8_ = uVar84;
                    auVar65._0_8_ = VVar97.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    local_3d0 = vmovlpd_avx(auVar65);
                    local_3c0 = local_3d0;
                    local_3b8 = local_3c8;
                    pstd::optional<pbrt::BSDFSample>::operator->
                              ((optional<pbrt::BSDFSample> *)0x703142);
                    VVar97 = Tuple3<pbrt::Vector3,_float>::operator-
                                       ((Tuple3<pbrt::Vector3,_float> *)
                                        CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10
                                                ));
                    local_408 = VVar97.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar64._8_8_ = uVar85;
                    auVar64._0_8_ = VVar97.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    local_410 = vmovlpd_avx(auVar64);
                    local_3f8 = local_3b8;
                    local_400 = local_3c0;
                    wo_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed80;
                    wo_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffed78.x;
                    wo_00.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_ffffffffffffed78.y;
                    wi_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed60;
                    wi_00.super_Tuple3<pbrt::Vector3,_float>.x =
                         (float)(int)in_stack_ffffffffffffed58;
                    wi_00.super_Tuple3<pbrt::Vector3,_float>.y =
                         (float)(int)((ulong)in_stack_ffffffffffffed58 >> 0x20);
                    local_3f0 = local_410;
                    local_3e8 = local_408;
                    local_3e0 = local_410;
                    local_3d8 = local_408;
                    HGPhaseFunction::PDF
                              ((HGPhaseFunction *)
                               CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),wo_00,
                               wi_00);
                    auVar88 = (undefined1  [56])0x0;
                    local_3b0 = PowerHeuristic((int)in_stack_ffffffffffffed20,
                                               in_stack_ffffffffffffed1c,
                                               (int)in_stack_ffffffffffffed18,
                                               in_stack_ffffffffffffed14);
                    uVar84 = 0;
                  }
                  SVar96 = SampledSpectrum::operator*
                                     ((SampledSpectrum *)
                                      CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
                                      (SampledSpectrum *)
                                      CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10))
                  ;
                  auVar92._0_8_ = SVar96.values.values._8_8_;
                  auVar92._8_56_ = auVar88;
                  uVar85 = auVar88._0_8_;
                  auVar63._8_8_ = uVar84;
                  auVar63._0_8_ = SVar96.values.values._0_8_;
                  local_470 = vmovlpd_avx(auVar63);
                  local_468 = vmovlpd_avx(auVar92._0_16_);
                  VVar97 = Tuple3<pbrt::Vector3,_float>::operator-
                                     ((Tuple3<pbrt::Vector3,_float> *)
                                      CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10))
                  ;
                  local_488 = VVar97.super_Tuple3<pbrt::Vector3,_float>.z;
                  uVar84 = 0;
                  auVar62._8_8_ = uVar85;
                  auVar62._0_8_ = VVar97.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  local_490 = vmovlpd_avx(auVar62);
                  local_480 = local_490;
                  local_478 = local_488;
                  pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x703327);
                  VVar97 = Tuple3<pbrt::Vector3,_float>::operator-
                                     ((Tuple3<pbrt::Vector3,_float> *)
                                      CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10))
                  ;
                  local_4c8 = VVar97.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar61._8_8_ = uVar84;
                  auVar61._0_8_ = VVar97.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  local_4d0 = vmovlpd_avx(auVar61);
                  local_4b8 = local_478;
                  local_4c0 = local_480;
                  uVar85 = 0;
                  wo_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_ffffffffffffed8c;
                  wo_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_ffffffffffffed88;
                  wo_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed90;
                  wi_01.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_ffffffffffffed6c;
                  wi_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_ffffffffffffed68;
                  wi_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed70;
                  local_4b0 = local_4d0;
                  local_4a8 = local_4c8;
                  local_4a0 = local_4d0;
                  local_498 = local_4c8;
                  HGPhaseFunction::p(in_stack_ffffffffffffed50,wo_01,wi_01);
                  uVar84 = 0;
                  SVar96 = SampledSpectrum::operator*
                                     ((SampledSpectrum *)
                                      CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                                      in_stack_ffffffffffffed1c);
                  auVar59._8_8_ = uVar85;
                  auVar59._0_8_ = SVar96.values.values._8_8_;
                  auVar60._8_8_ = uVar84;
                  auVar60._0_8_ = SVar96.values.values._0_8_;
                  local_460 = vmovlpd_avx(auVar60);
                  local_458 = vmovlpd_avx(auVar59);
                  uVar85 = 0;
                  SVar96 = SampledSpectrum::operator*
                                     ((SampledSpectrum *)
                                      CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                                      in_stack_ffffffffffffed1c);
                  auVar57._8_8_ = uVar84;
                  auVar57._0_8_ = SVar96.values.values._8_8_;
                  auVar58._8_8_ = uVar85;
                  auVar58._0_8_ = SVar96.values.values._0_8_;
                  local_450 = vmovlpd_avx(auVar58);
                  local_448 = vmovlpd_avx(auVar57);
                  pBVar72 = pstd::optional<pbrt::BSDFSample>::operator->
                                      ((optional<pbrt::BSDFSample> *)0x7034d8);
                  local_4e8 = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                  local_4f0._0_4_ = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.x;
                  local_4f0._4_4_ = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.y;
                  uVar85 = 0;
                  w_01.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_ffffffffffffed1c;
                  w_01.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffed18;
                  w_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed20;
                  local_4e0 = local_4f0;
                  local_4d8 = local_4e8;
                  Tr(0.0,w_01);
                  uVar84 = 0;
                  SVar96 = SampledSpectrum::operator*
                                     ((SampledSpectrum *)
                                      CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                                      in_stack_ffffffffffffed1c);
                  auVar55._8_8_ = uVar85;
                  auVar55._0_8_ = SVar96.values.values._8_8_;
                  auVar56._8_8_ = uVar84;
                  auVar56._0_8_ = SVar96.values.values._0_8_;
                  local_440 = vmovlpd_avx(auVar56);
                  local_438 = vmovlpd_avx(auVar55);
                  pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x7035a4);
                  SVar96 = SampledSpectrum::operator*
                                     ((SampledSpectrum *)
                                      CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
                                      (SampledSpectrum *)
                                      CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10))
                  ;
                  auVar53._8_8_ = uVar84;
                  auVar53._0_8_ = SVar96.values.values._8_8_;
                  auVar54._8_8_ = uVar85;
                  auVar54._0_8_ = SVar96.values.values._0_8_;
                  local_430 = vmovlpd_avx(auVar54);
                  local_428 = vmovlpd_avx(auVar53);
                  pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x703608);
                  uVar84 = 0;
                  SVar96 = SampledSpectrum::operator/
                                     ((SampledSpectrum *)
                                      CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
                                      in_stack_ffffffffffffed14);
                  auVar51._8_8_ = uVar85;
                  auVar51._0_8_ = SVar96.values.values._8_8_;
                  auVar52._8_8_ = uVar84;
                  auVar52._0_8_ = SVar96.values.values._0_8_;
                  local_420 = vmovlpd_avx(auVar52);
                  local_418 = vmovlpd_avx(auVar51);
                  SampledSpectrum::operator+=
                            ((SampledSpectrum *)
                             CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                             (SampledSpectrum *)
                             CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
                  LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::f::
                  anon_class_8_1_ba1d750b::operator()
                            ((anon_class_8_1_ba1d750b *)
                             CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
                  LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::f::
                  anon_class_8_1_ba1d750b::operator()
                            ((anon_class_8_1_ba1d750b *)
                             CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
                  uVar84 = 0;
                  Point2<float>::Point2
                            ((Point2<float> *)
                             CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
                             in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08);
                  VVar97 = Tuple3<pbrt::Vector3,_float>::operator-
                                     ((Tuple3<pbrt::Vector3,_float> *)
                                      CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10))
                  ;
                  local_540 = VVar97.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar50._8_8_ = uVar84;
                  auVar50._0_8_ = VVar97.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  local_548 = vmovlpd_avx(auVar50);
                  local_538 = local_4f8;
                  auVar79 = ZEXT864(local_548);
                  auVar91 = ZEXT464(0);
                  wo_04.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_ffffffffffffed94;
                  wo_04.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffed90;
                  wo_04.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed98;
                  local_530 = local_548;
                  local_528 = local_540;
                  local_520 = local_548;
                  local_518 = local_540;
                  HGPhaseFunction::Sample_p
                            ((HGPhaseFunction *)
                             CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),wo_04,
                             (Point2f)in_stack_ffffffffffffed78);
                  bVar71 = pstd::optional::operator_cast_to_bool(local_510);
                  if (bVar71) {
                    pPVar74 = pstd::optional<pbrt::PhaseFunctionSample>::operator->
                                        ((optional<pbrt::PhaseFunctionSample> *)0x7037bf);
                    fVar76 = pPVar74->pdf;
                    auVar79 = ZEXT464((uint)fVar76);
                    auVar91 = ZEXT1664((undefined1  [16])0x0);
                    if ((fVar76 != 0.0) || (NAN(fVar76))) {
                      pPVar74 = pstd::optional<pbrt::PhaseFunctionSample>::operator->
                                          ((optional<pbrt::PhaseFunctionSample> *)0x7037f1);
                      fVar76 = (pPVar74->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar79 = ZEXT464((uint)fVar76);
                      auVar91 = ZEXT1664((undefined1  [16])0x0);
                      auVar88 = auVar91._8_56_;
                      if ((fVar76 != 0.0) || (NAN(fVar76))) {
                        pstd::optional<pbrt::PhaseFunctionSample>::operator->
                                  ((optional<pbrt::PhaseFunctionSample> *)0x70386b);
                        uVar84 = 0;
                        SVar96 = SampledSpectrum::operator*
                                           ((SampledSpectrum *)
                                            CONCAT44(in_stack_ffffffffffffed24,
                                                     in_stack_ffffffffffffed20),
                                            in_stack_ffffffffffffed1c);
                        auVar93._0_8_ = SVar96.values.values._8_8_;
                        auVar93._8_56_ = auVar88;
                        auVar49._8_8_ = uVar84;
                        auVar49._0_8_ = SVar96.values.values._0_8_;
                        local_568 = vmovlpd_avx(auVar49);
                        local_560 = vmovlpd_avx(auVar93._0_16_);
                        pstd::optional<pbrt::PhaseFunctionSample>::operator->
                                  ((optional<pbrt::PhaseFunctionSample> *)0x7038d3);
                        uVar85 = 0;
                        SVar96 = SampledSpectrum::operator/
                                           ((SampledSpectrum *)
                                            CONCAT44(in_stack_ffffffffffffed1c,
                                                     in_stack_ffffffffffffed18),
                                            in_stack_ffffffffffffed14);
                        auVar47._8_8_ = uVar84;
                        auVar47._0_8_ = SVar96.values.values._8_8_;
                        auVar48._8_8_ = uVar85;
                        auVar48._0_8_ = SVar96.values.values._0_8_;
                        local_558 = vmovlpd_avx(auVar48);
                        local_550 = vmovlpd_avx(auVar47);
                        SampledSpectrum::operator*=
                                  ((SampledSpectrum *)
                                   CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                                   (SampledSpectrum *)
                                   CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
                        pPVar74 = pstd::optional<pbrt::PhaseFunctionSample>::operator->
                                            ((optional<pbrt::PhaseFunctionSample> *)0x703953);
                        local_370._0_4_ = (pPVar74->wi).super_Tuple3<pbrt::Vector3,_float>.x;
                        local_370._4_4_ = (pPVar74->wi).super_Tuple3<pbrt::Vector3,_float>.y;
                        local_368 = (pPVar74->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                        local_364 = local_3ac;
                        auVar91 = ZEXT464((uint)local_3ac);
                        if (local_124 <= local_3ac) {
LAB_007039b8:
                          auVar79 = ZEXT464((uint)local_3ac);
                          if ((local_3ac <= local_124) ||
                             (auVar79 = ZEXT1664((undefined1  [16])0x0), 0.0 <= local_368))
                          goto LAB_00703e8b;
                        }
                        else {
                          auVar79 = ZEXT464((uint)local_368);
                          auVar91 = ZEXT1664((undefined1  [16])0x0);
                          if (local_368 <= 0.0) goto LAB_007039b8;
                        }
                        TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::Flags
                                  ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> *)
                                   CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
                        bVar71 = IsSpecular(Unset);
                        auVar88 = auVar79._8_56_;
                        if (!bVar71) {
                          VVar97 = Tuple3<pbrt::Vector3,_float>::operator-
                                             ((Tuple3<pbrt::Vector3,_float> *)
                                              CONCAT44(in_stack_ffffffffffffed14,
                                                       in_stack_ffffffffffffed10));
                          local_5b0 = VVar97.super_Tuple3<pbrt::Vector3,_float>.z;
                          auVar80._0_8_ = VVar97.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                          auVar80._8_56_ = auVar88;
                          local_5b8 = vmovlpd_avx(auVar80._0_16_);
                          local_5a0 = local_34;
                          local_5a8 = local_3c;
                          uVar84 = 0;
                          uVar85 = 0;
                          local_5c0 = local_34;
                          local_5c8 = local_3c;
                          wo_08.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffedd0;
                          wo_08.super_Tuple3<pbrt::Vector3,_float>.x =
                               (float)(int)in_stack_ffffffffffffedc8;
                          wo_08.super_Tuple3<pbrt::Vector3,_float>.y =
                               (float)(int)((ulong)in_stack_ffffffffffffedc8 >> 0x20);
                          wi_03.super_Tuple3<pbrt::Vector3,_float>.y =
                               (float)in_stack_ffffffffffffedb0;
                          wi_03.super_Tuple3<pbrt::Vector3,_float>.x =
                               (float)in_stack_ffffffffffffedac;
                          wi_03.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffedb4;
                          local_598 = local_5b8;
                          local_590 = local_5b0;
                          local_588 = local_5b8;
                          local_580 = local_5b0;
                          SVar96 = TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::f
                                             ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>
                                               *)CONCAT44(in_stack_ffffffffffffed94,
                                                          in_stack_ffffffffffffed90),wo_08,wi_03,
                                              in_stack_ffffffffffffed8c);
                          auVar45._8_8_ = uVar85;
                          auVar45._0_8_ = SVar96.values.values._8_8_;
                          auVar79 = ZEXT1664(auVar45);
                          auVar46._8_8_ = uVar84;
                          auVar46._0_8_ = SVar96.values.values._0_8_;
                          auVar91 = ZEXT1664(auVar46);
                          local_578 = vmovlpd_avx(auVar46);
                          local_570 = vmovlpd_avx(auVar45);
                          bVar71 = SampledSpectrum::operator_cast_to_bool
                                             ((SampledSpectrum *)
                                              CONCAT44(in_stack_ffffffffffffed1c,
                                                       in_stack_ffffffffffffed18));
                          auVar88 = auVar79._8_56_;
                          if (bVar71) {
                            VVar97 = Tuple3<pbrt::Vector3,_float>::operator-
                                               ((Tuple3<pbrt::Vector3,_float> *)
                                                CONCAT44(in_stack_ffffffffffffed14,
                                                         in_stack_ffffffffffffed10));
                            local_600 = VVar97.super_Tuple3<pbrt::Vector3,_float>.z;
                            auVar81._0_8_ = VVar97.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                            auVar81._8_56_ = auVar88;
                            local_608 = vmovlpd_avx(auVar81._0_16_);
                            local_5f0 = local_34;
                            local_5f8 = local_3c;
                            local_610 = local_34;
                            local_618 = local_3c;
                            wi_06.super_Tuple3<pbrt::Vector3,_float>.y =
                                 (float)(int)in_stack_ffffffffffffedc0;
                            wi_06.super_Tuple3<pbrt::Vector3,_float>.z =
                                 (float)(int)((ulong)in_stack_ffffffffffffedc0 >> 0x20);
                            wi_06.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffedbc;
                            local_5e8 = local_608;
                            local_5e0 = local_600;
                            local_5d8 = local_608;
                            local_5d0 = local_600;
                            local_5cc = TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::
                                        PDF(in_stack_ffffffffffffeda0,
                                            (Vector3f)in_stack_ffffffffffffedd8,wi_06,
                                            (TransportMode)in_stack_ffffffffffffed9c,
                                            (BxDFReflTransFlags)in_stack_ffffffffffffed98);
                            pstd::optional<pbrt::PhaseFunctionSample>::operator->
                                      ((optional<pbrt::PhaseFunctionSample> *)0x703c96);
                            local_61c = PowerHeuristic((int)in_stack_ffffffffffffed20,
                                                       in_stack_ffffffffffffed1c,
                                                       (int)in_stack_ffffffffffffed18,
                                                       in_stack_ffffffffffffed14);
                            pPVar74 = pstd::optional<pbrt::PhaseFunctionSample>::operator->
                                                ((optional<pbrt::PhaseFunctionSample> *)0x703d0b);
                            local_660 = (pPVar74->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                            local_668._0_4_ = (pPVar74->wi).super_Tuple3<pbrt::Vector3,_float>.x;
                            local_668._4_4_ = (pPVar74->wi).super_Tuple3<pbrt::Vector3,_float>.y;
                            uVar85 = 0;
                            w_02.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_ffffffffffffed1c;
                            w_02.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffed18;
                            w_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed20;
                            local_658 = local_668;
                            local_650 = local_660;
                            Tr(0.0,w_02);
                            uVar84 = 0;
                            SVar96 = SampledSpectrum::operator*
                                               ((SampledSpectrum *)
                                                CONCAT44(in_stack_ffffffffffffed24,
                                                         in_stack_ffffffffffffed20),
                                                in_stack_ffffffffffffed1c);
                            auVar43._8_8_ = uVar85;
                            auVar43._0_8_ = SVar96.values.values._8_8_;
                            auVar44._8_8_ = uVar84;
                            auVar44._0_8_ = SVar96.values.values._0_8_;
                            local_64c = vmovlpd_avx(auVar44);
                            local_644 = vmovlpd_avx(auVar43);
                            SVar96 = SampledSpectrum::operator*
                                               ((SampledSpectrum *)
                                                CONCAT44(in_stack_ffffffffffffed1c,
                                                         in_stack_ffffffffffffed18),
                                                (SampledSpectrum *)
                                                CONCAT44(in_stack_ffffffffffffed14,
                                                         in_stack_ffffffffffffed10));
                            auVar41._8_8_ = uVar84;
                            auVar41._0_8_ = SVar96.values.values._8_8_;
                            auVar42._8_8_ = uVar85;
                            auVar42._0_8_ = SVar96.values.values._0_8_;
                            local_63c = vmovlpd_avx(auVar42);
                            local_634 = vmovlpd_avx(auVar41);
                            uVar84 = 0;
                            SVar96 = SampledSpectrum::operator*
                                               ((SampledSpectrum *)
                                                CONCAT44(in_stack_ffffffffffffed24,
                                                         in_stack_ffffffffffffed20),
                                                in_stack_ffffffffffffed1c);
                            auVar39._8_8_ = uVar85;
                            auVar39._0_8_ = SVar96.values.values._8_8_;
                            auVar79 = ZEXT1664(auVar39);
                            auVar40._8_8_ = uVar84;
                            auVar40._0_8_ = SVar96.values.values._0_8_;
                            auVar91 = ZEXT1664(auVar40);
                            local_62c = vmovlpd_avx(auVar40);
                            local_624 = vmovlpd_avx(auVar39);
                            SampledSpectrum::operator+=
                                      ((SampledSpectrum *)
                                       CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20)
                                       ,(SampledSpectrum *)
                                        CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18
                                                ));
                          }
                        }
                      }
                    }
                  }
LAB_00703e8b:
                  local_2c8 = 7;
                  pstd::optional<pbrt::PhaseFunctionSample>::~optional
                            ((optional<pbrt::PhaseFunctionSample> *)0x703e98);
                  goto LAB_007052c5;
                }
              }
              local_364 = Clamp<float,int,float>(local_b7c,0,in_RDI[4].mfDistrib.alpha_x);
              goto LAB_00703ed7;
            }
          }
          else {
            fVar76 = in_RDI[4].mfDistrib.alpha_x;
            if ((local_364 != fVar76) || (NAN(local_364) || NAN(fVar76))) {
              local_b64 = in_RDI[4].mfDistrib.alpha_x;
            }
            else {
              local_b64 = 0.0;
            }
            local_364 = local_b64;
            local_388 = local_368;
            local_390 = local_370;
            local_398 = local_368;
            local_3a0 = local_370;
            w_00.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_ffffffffffffed1c;
            w_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffed18;
            w_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed20;
            Tr(0.0,w_00);
            SampledSpectrum::operator*=
                      ((SampledSpectrum *)
                       CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                       in_stack_ffffffffffffed1c);
LAB_00703ed7:
            uVar84 = 0;
            if ((local_364 != local_124) || (NAN(local_364) || NAN(local_124))) {
              TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::Flags
                        ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> *)
                         CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
              bVar71 = IsSpecular(Unset);
              if (!bVar71) {
                local_714 = 1.0;
                TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::Flags
                          ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> *)
                           CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
                bVar71 = IsSpecular(Unset);
                if (!bVar71) {
                  pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x7043a0);
                  uVar84 = 0;
                  VVar97 = Tuple3<pbrt::Vector3,_float>::operator-
                                     ((Tuple3<pbrt::Vector3,_float> *)
                                      CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10))
                  ;
                  local_728 = VVar97.super_Tuple3<pbrt::Vector3,_float>.z;
                  uVar85 = 0;
                  auVar33._8_8_ = uVar84;
                  auVar33._0_8_ = VVar97.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  local_730 = vmovlpd_avx(auVar33);
                  local_720 = local_730;
                  local_718 = local_728;
                  pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x704430);
                  VVar97 = Tuple3<pbrt::Vector3,_float>::operator-
                                     ((Tuple3<pbrt::Vector3,_float> *)
                                      CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10))
                  ;
                  local_768 = VVar97.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar32._8_8_ = uVar85;
                  auVar32._0_8_ = VVar97.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  local_770 = vmovlpd_avx(auVar32);
                  local_758 = local_718;
                  local_760 = local_720;
                  wi_07.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_ffffffffffffedc0
                  ;
                  wi_07.super_Tuple3<pbrt::Vector3,_float>.z =
                       (float)(int)((ulong)in_stack_ffffffffffffedc0 >> 0x20);
                  wi_07.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffedbc;
                  local_750 = local_770;
                  local_748 = local_768;
                  local_740 = local_770;
                  local_738 = local_768;
                  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::PDF
                            (in_stack_ffffffffffffeda0,(Vector3f)in_stack_ffffffffffffedd8,wi_07,
                             (TransportMode)in_stack_ffffffffffffed9c,
                             (BxDFReflTransFlags)in_stack_ffffffffffffed98);
                  local_714 = PowerHeuristic((int)in_stack_ffffffffffffed20,
                                             in_stack_ffffffffffffed1c,
                                             (int)in_stack_ffffffffffffed18,
                                             in_stack_ffffffffffffed14);
                  uVar84 = 0;
                }
                VVar97 = Tuple3<pbrt::Vector3,_float>::operator-
                                   ((Tuple3<pbrt::Vector3,_float> *)
                                    CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
                local_7f8 = VVar97.super_Tuple3<pbrt::Vector3,_float>.z;
                uVar85 = 0;
                auVar31._8_8_ = uVar84;
                auVar31._0_8_ = VVar97.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                local_800 = vmovlpd_avx(auVar31);
                local_7f0 = local_800;
                local_7e8 = local_7f8;
                pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x7045d0)
                ;
                VVar97 = Tuple3<pbrt::Vector3,_float>::operator-
                                   ((Tuple3<pbrt::Vector3,_float> *)
                                    CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
                local_838 = VVar97.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar30._8_8_ = uVar85;
                auVar30._0_8_ = VVar97.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                local_840 = vmovlpd_avx(auVar30);
                local_828 = local_7e8;
                local_830 = local_7f0;
                uVar84 = 0;
                uVar85 = 0;
                wo_09.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffedd0;
                wo_09.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_ffffffffffffedc8;
                wo_09.super_Tuple3<pbrt::Vector3,_float>.y =
                     (float)(int)((ulong)in_stack_ffffffffffffedc8 >> 0x20);
                wi_04.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_ffffffffffffedb0;
                wi_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_ffffffffffffedac;
                wi_04.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffedb4;
                local_820 = local_840;
                local_818 = local_838;
                local_810 = local_840;
                local_808 = local_838;
                SVar96 = TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::f
                                   ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> *)
                                    CONCAT44(in_stack_ffffffffffffed94,in_stack_ffffffffffffed90),
                                    wo_09,wi_04,in_stack_ffffffffffffed8c);
                auVar28._8_8_ = uVar85;
                auVar28._0_8_ = SVar96.values.values._8_8_;
                auVar29._8_8_ = uVar84;
                auVar29._0_8_ = SVar96.values.values._0_8_;
                local_7e0 = vmovlpd_avx(auVar29);
                local_7d8 = vmovlpd_avx(auVar28);
                SVar96 = SampledSpectrum::operator*
                                   ((SampledSpectrum *)
                                    CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
                                    (SampledSpectrum *)
                                    CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
                auVar26._8_8_ = uVar84;
                auVar26._0_8_ = SVar96.values.values._8_8_;
                auVar27._8_8_ = uVar85;
                auVar27._0_8_ = SVar96.values.values._0_8_;
                local_7d0 = vmovlpd_avx(auVar27);
                local_7c8 = vmovlpd_avx(auVar26);
                pBVar72 = pstd::optional<pbrt::BSDFSample>::operator->
                                    ((optional<pbrt::BSDFSample> *)0x704747);
                local_858 = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                local_860._0_4_ = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.x;
                local_860._4_4_ = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.y;
                uVar85 = 0;
                w_07.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_ffffffffffffed20;
                w_07.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffed1c;
                w_07.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed24;
                local_850 = local_860;
                local_848 = local_858;
                AbsCosTheta(w_07);
                uVar84 = 0;
                SVar96 = SampledSpectrum::operator*
                                   ((SampledSpectrum *)
                                    CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                                    in_stack_ffffffffffffed1c);
                auVar24._8_8_ = uVar85;
                auVar24._0_8_ = SVar96.values.values._8_8_;
                auVar25._8_8_ = uVar84;
                auVar25._0_8_ = SVar96.values.values._0_8_;
                local_7c0 = vmovlpd_avx(auVar25);
                local_7b8 = vmovlpd_avx(auVar24);
                uVar85 = 0;
                SVar96 = SampledSpectrum::operator*
                                   ((SampledSpectrum *)
                                    CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                                    in_stack_ffffffffffffed1c);
                auVar22._8_8_ = uVar84;
                auVar22._0_8_ = SVar96.values.values._8_8_;
                auVar23._8_8_ = uVar85;
                auVar23._0_8_ = SVar96.values.values._0_8_;
                local_7b0 = vmovlpd_avx(auVar23);
                local_7a8 = vmovlpd_avx(auVar22);
                pBVar72 = pstd::optional<pbrt::BSDFSample>::operator->
                                    ((optional<pbrt::BSDFSample> *)0x70486e);
                local_878 = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                local_880._0_4_ = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.x;
                local_880._4_4_ = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.y;
                uVar85 = 0;
                w_03.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_ffffffffffffed1c;
                w_03.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffed18;
                w_03.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed20;
                local_870 = local_880;
                local_868 = local_878;
                Tr(0.0,w_03);
                uVar84 = 0;
                SVar96 = SampledSpectrum::operator*
                                   ((SampledSpectrum *)
                                    CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                                    in_stack_ffffffffffffed1c);
                auVar20._8_8_ = uVar85;
                auVar20._0_8_ = SVar96.values.values._8_8_;
                auVar21._8_8_ = uVar84;
                auVar21._0_8_ = SVar96.values.values._0_8_;
                local_7a0 = vmovlpd_avx(auVar21);
                local_798 = vmovlpd_avx(auVar20);
                pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x70493a)
                ;
                SVar96 = SampledSpectrum::operator*
                                   ((SampledSpectrum *)
                                    CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
                                    (SampledSpectrum *)
                                    CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
                auVar18._8_8_ = uVar84;
                auVar18._0_8_ = SVar96.values.values._8_8_;
                auVar19._8_8_ = uVar85;
                auVar19._0_8_ = SVar96.values.values._0_8_;
                local_790 = vmovlpd_avx(auVar19);
                local_788 = vmovlpd_avx(auVar18);
                pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x70499e)
                ;
                uVar84 = 0;
                SVar96 = SampledSpectrum::operator/
                                   ((SampledSpectrum *)
                                    CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
                                    in_stack_ffffffffffffed14);
                auVar16._8_8_ = uVar85;
                auVar16._0_8_ = SVar96.values.values._8_8_;
                auVar17._8_8_ = uVar84;
                auVar17._0_8_ = SVar96.values.values._0_8_;
                local_780 = vmovlpd_avx(auVar17);
                local_778 = vmovlpd_avx(auVar16);
                SampledSpectrum::operator+=
                          ((SampledSpectrum *)
                           CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                           (SampledSpectrum *)
                           CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
              }
              local_884 = LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::f::
                          anon_class_8_1_ba1d750b::operator()
                                    ((anon_class_8_1_ba1d750b *)
                                     CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
              LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::f::
              anon_class_8_1_ba1d750b::operator()
                        ((anon_class_8_1_ba1d750b *)
                         CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
              LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::f::
              anon_class_8_1_ba1d750b::operator()
                        ((anon_class_8_1_ba1d750b *)
                         CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
              uVar84 = 0;
              Point2<float>::Point2
                        ((Point2<float> *)
                         CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
                         in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08);
              VVar97 = Tuple3<pbrt::Vector3,_float>::operator-
                                 ((Tuple3<pbrt::Vector3,_float> *)
                                  CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
              auVar15._8_8_ = uVar84;
              auVar15._0_8_ = VVar97.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              uVar1 = vmovlpd_avx(auVar15);
              auVar79 = ZEXT864(uVar1);
              auVar91 = ZEXT464(0);
              wo_06.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_ffffffffffffed94;
              wo_06.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffed90;
              wo_06.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed98;
              TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::Sample_f
                        ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> *)
                         CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),wo_06,
                         in_stack_ffffffffffffed6c,(Point2f)in_stack_ffffffffffffed78,
                         in_stack_ffffffffffffed68,in_stack_ffffffffffffed64);
              bVar71 = pstd::optional::operator_cast_to_bool(local_8bc);
              if (bVar71) {
                pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x704b99)
                ;
                bVar71 = SampledSpectrum::operator_cast_to_bool
                                   ((SampledSpectrum *)
                                    CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
                if (!bVar71) goto LAB_00704c28;
                pBVar72 = pstd::optional<pbrt::BSDFSample>::operator->
                                    ((optional<pbrt::BSDFSample> *)0x704bd3);
                fVar76 = pBVar72->pdf;
                auVar79 = ZEXT464((uint)fVar76);
                auVar91 = ZEXT1664((undefined1  [16])0x0);
                if ((fVar76 == 0.0) && (!NAN(fVar76))) goto LAB_00704c28;
                pBVar72 = pstd::optional<pbrt::BSDFSample>::operator->
                                    ((optional<pbrt::BSDFSample> *)0x704c05);
                fVar76 = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                auVar79 = ZEXT464((uint)fVar76);
                auVar91 = ZEXT1664((undefined1  [16])0x0);
                if ((fVar76 == 0.0) && (!NAN(fVar76))) goto LAB_00704c28;
                pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x704c6b)
                ;
                pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x704c92)
                ;
                uVar85 = 0;
                w_08.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_ffffffffffffed20;
                w_08.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffed1c;
                w_08.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed24;
                AbsCosTheta(w_08);
                uVar84 = 0;
                SVar96 = SampledSpectrum::operator*
                                   ((SampledSpectrum *)
                                    CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                                    in_stack_ffffffffffffed1c);
                auVar13._8_8_ = uVar85;
                auVar13._0_8_ = SVar96.values.values._8_8_;
                auVar14._8_8_ = uVar84;
                auVar14._0_8_ = SVar96.values.values._0_8_;
                vmovlpd_avx(auVar14);
                vmovlpd_avx(auVar13);
                pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x704d55)
                ;
                uVar85 = 0;
                SVar96 = SampledSpectrum::operator/
                                   ((SampledSpectrum *)
                                    CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
                                    in_stack_ffffffffffffed14);
                auVar11._8_8_ = uVar84;
                auVar11._0_8_ = SVar96.values.values._8_8_;
                auVar79 = ZEXT1664(auVar11);
                auVar12._8_8_ = uVar85;
                auVar12._0_8_ = SVar96.values.values._0_8_;
                auVar91 = ZEXT1664(auVar12);
                vmovlpd_avx(auVar12);
                vmovlpd_avx(auVar11);
                SampledSpectrum::operator*=
                          ((SampledSpectrum *)
                           CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                           (SampledSpectrum *)
                           CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
                pBVar72 = pstd::optional<pbrt::BSDFSample>::operator->
                                    ((optional<pbrt::BSDFSample> *)0x704dd5);
                local_368 = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                local_370._0_4_ = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.x;
                local_370._4_4_ = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.y;
                TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::Flags
                          ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> *)
                           CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
                bVar71 = IsSpecular(Unset);
                auVar88 = auVar79._8_56_;
                if (!bVar71) {
                  VVar97 = Tuple3<pbrt::Vector3,_float>::operator-
                                     ((Tuple3<pbrt::Vector3,_float> *)
                                      CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10))
                  ;
                  auVar82._0_8_ = VVar97.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar82._8_56_ = auVar88;
                  vmovlpd_avx(auVar82._0_16_);
                  uVar84 = 0;
                  in_stack_ffffffffffffedc0 = 0;
                  wo_10.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffedd0;
                  wo_10.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_ffffffffffffedc8
                  ;
                  wo_10.super_Tuple3<pbrt::Vector3,_float>.y =
                       (float)(int)((ulong)in_stack_ffffffffffffedc8 >> 0x20);
                  wi_05.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_ffffffffffffedb0;
                  wi_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_ffffffffffffedac;
                  wi_05.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffedb4;
                  SVar96 = TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::f
                                     ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> *)
                                      CONCAT44(in_stack_ffffffffffffed94,in_stack_ffffffffffffed90),
                                      wo_10,wi_05,in_stack_ffffffffffffed8c);
                  in_stack_ffffffffffffedc8 = SVar96.values.values._0_8_;
                  in_stack_ffffffffffffedbc = SVar96.values.values[3];
                  in_stack_ffffffffffffedd0 = (float)uVar84;
                  uStack_122c = (undefined4)((ulong)uVar84 >> 0x20);
                  auVar9._8_8_ = in_stack_ffffffffffffedc0;
                  auVar9._0_8_ = SVar96.values.values._8_8_;
                  auVar79 = ZEXT1664(auVar9);
                  auVar10._8_4_ = in_stack_ffffffffffffedd0;
                  auVar10._0_8_ = in_stack_ffffffffffffedc8;
                  auVar10._12_4_ = uStack_122c;
                  auVar91 = ZEXT1664(auVar10);
                  vmovlpd_avx(auVar10);
                  vmovlpd_avx(auVar9);
                  bVar71 = SampledSpectrum::operator_cast_to_bool
                                     ((SampledSpectrum *)
                                      CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18))
                  ;
                  pTVar86 = auVar79._8_8_;
                  in_stack_ffffffffffffedb4 =
                       (float)CONCAT13(bVar71,SUB43(in_stack_ffffffffffffedb4,0));
                  if (bVar71) {
                    in_stack_ffffffffffffedb0 =
                         TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::Flags
                                   ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> *)
                                    CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
                    bVar71 = IsSpecular(Unset);
                    in_stack_ffffffffffffedac = CONCAT13(bVar71,(int3)in_stack_ffffffffffffedac);
                    if (!bVar71) {
                      in_stack_ffffffffffffeda0 = pTVar86;
                      VVar97 = Tuple3<pbrt::Vector3,_float>::operator-
                                         ((Tuple3<pbrt::Vector3,_float> *)
                                          CONCAT44(in_stack_ffffffffffffed14,
                                                   in_stack_ffffffffffffed10));
                      in_stack_ffffffffffffed94 = VVar97.super_Tuple3<pbrt::Vector3,_float>.z;
                      in_stack_ffffffffffffed98 = VVar97.super_Tuple3<pbrt::Vector3,_float>.x;
                      in_stack_ffffffffffffed9c = VVar97.super_Tuple3<pbrt::Vector3,_float>.y;
                      auVar8._8_8_ = in_stack_ffffffffffffeda0;
                      auVar8._0_8_ = VVar97.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                      vmovlpd_avx(auVar8);
                      wi_08.super_Tuple3<pbrt::Vector3,_float>.y =
                           (float)(int)in_stack_ffffffffffffedc0;
                      wi_08.super_Tuple3<pbrt::Vector3,_float>.z =
                           (float)(int)((ulong)in_stack_ffffffffffffedc0 >> 0x20);
                      wi_08.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffedbc;
                      in_stack_ffffffffffffed90 =
                           TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::PDF
                                     (in_stack_ffffffffffffeda0,(Vector3f)in_stack_ffffffffffffedd8,
                                      wi_08,(TransportMode)in_stack_ffffffffffffed9c,
                                      (BxDFReflTransFlags)in_stack_ffffffffffffed98);
                      pBVar72 = pstd::optional<pbrt::BSDFSample>::operator->
                                          ((optional<pbrt::BSDFSample> *)0x7050f7);
                      in_stack_ffffffffffffed88 = SUB84(pBVar72,0);
                      in_stack_ffffffffffffed8c = (TransportMode)((ulong)pBVar72 >> 0x20);
                      PowerHeuristic((int)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c,
                                     (int)in_stack_ffffffffffffed18,in_stack_ffffffffffffed14);
                    }
                    in_stack_ffffffffffffed74 = in_RDI[4].mfDistrib.alpha_x;
                    in_stack_ffffffffffffed78 =
                         (Tuple2<pbrt::Point2,_float>)
                         pstd::optional<pbrt::BSDFSample>::operator->
                                   ((optional<pbrt::BSDFSample> *)0x70515a);
                    pHVar87 = (HGPhaseFunction *)0x0;
                    w_04.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_ffffffffffffed1c;
                    w_04.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffed18;
                    w_04.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed20;
                    in_stack_ffffffffffffed70 = Tr(0.0,w_04);
                    uVar84 = 0;
                    SVar96 = SampledSpectrum::operator*
                                       ((SampledSpectrum *)
                                        CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20
                                                ),in_stack_ffffffffffffed1c);
                    in_stack_ffffffffffffed58 = SVar96.values.values._0_8_;
                    in_stack_ffffffffffffed60 = (float)uVar84;
                    in_stack_ffffffffffffed64 = (BxDFReflTransFlags)((ulong)uVar84 >> 0x20);
                    auVar6._8_8_ = pHVar87;
                    auVar6._0_8_ = SVar96.values.values._8_8_;
                    auVar7._8_4_ = in_stack_ffffffffffffed60;
                    auVar7._0_8_ = in_stack_ffffffffffffed58;
                    auVar7._12_4_ = in_stack_ffffffffffffed64;
                    uVar84 = auVar7._8_8_;
                    vmovlpd_avx(auVar7);
                    vmovlpd_avx(auVar6);
                    in_stack_ffffffffffffed50 = pHVar87;
                    SVar96 = SampledSpectrum::operator*
                                       ((SampledSpectrum *)
                                        CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18
                                                ),
                                        (SampledSpectrum *)
                                        CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10
                                                ));
                    in_stack_ffffffffffffed40 = SUB84(pHVar87,0);
                    in_stack_ffffffffffffed44 = (int)((ulong)pHVar87 >> 0x20);
                    auVar4._8_8_ = uVar84;
                    auVar4._0_8_ = SVar96.values.values._8_8_;
                    auVar5._8_4_ = in_stack_ffffffffffffed40;
                    auVar5._0_8_ = SVar96.values.values._0_8_;
                    auVar5._12_4_ = in_stack_ffffffffffffed44;
                    uVar84 = auVar5._8_8_;
                    vmovlpd_avx(auVar5);
                    vmovlpd_avx(auVar4);
                    this_00 = (SampledSpectrum *)0x0;
                    SVar96 = SampledSpectrum::operator*
                                       ((SampledSpectrum *)
                                        CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20
                                                ),in_stack_ffffffffffffed1c);
                    in_stack_ffffffffffffed08 = SVar96.values.values[2];
                    in_stack_ffffffffffffed0c = SVar96.values.values[3];
                    in_stack_ffffffffffffed10 = (undefined4)uVar84;
                    in_stack_ffffffffffffed14 = (Float)((ulong)uVar84 >> 0x20);
                    in_stack_ffffffffffffed18 = SVar96.values.values[0];
                    in_stack_ffffffffffffed1c = SVar96.values.values[1];
                    in_stack_ffffffffffffed20 = SUB84(this_00,0);
                    in_stack_ffffffffffffed24 = (float)((ulong)this_00 >> 0x20);
                    auVar2._8_4_ = in_stack_ffffffffffffed10;
                    auVar2._0_8_ = SVar96.values.values._8_8_;
                    auVar2._12_4_ = in_stack_ffffffffffffed14;
                    auVar79 = ZEXT1664(auVar2);
                    auVar3._8_4_ = in_stack_ffffffffffffed20;
                    auVar3._0_8_ = SVar96.values.values._0_8_;
                    auVar3._12_4_ = in_stack_ffffffffffffed24;
                    auVar91 = ZEXT1664(auVar3);
                    vmovlpd_avx(auVar3);
                    vmovlpd_avx(auVar2);
                    SampledSpectrum::operator+=(this_00,SVar96.values.values._0_8_);
                  }
                }
                local_2c8 = 0;
              }
              else {
LAB_00704c28:
                local_2c8 = 5;
              }
              pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)0x7052b2);
            }
            else {
              local_66c = LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::f::
                          anon_class_8_1_ba1d750b::operator()
                                    ((anon_class_8_1_ba1d750b *)
                                     CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
              uVar84 = 0;
              VVar97 = Tuple3<pbrt::Vector3,_float>::operator-
                                 ((Tuple3<pbrt::Vector3,_float> *)
                                  CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
              local_6b0 = VVar97.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar38._8_8_ = uVar84;
              auVar38._0_8_ = VVar97.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              local_6b8 = vmovlpd_avx(auVar38);
              local_6a8 = local_6b8;
              local_6a0 = local_6b0;
              LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::f::
              anon_class_8_1_ba1d750b::operator()
                        ((anon_class_8_1_ba1d750b *)
                         CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
              LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::f::
              anon_class_8_1_ba1d750b::operator()
                        ((anon_class_8_1_ba1d750b *)
                         CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10));
              Point2<float>::Point2
                        ((Point2<float> *)
                         CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
                         in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08);
              local_6c8 = local_6a0;
              local_6d0 = local_6a8;
              auVar79 = ZEXT864(local_6a8);
              auVar91 = ZEXT464(0);
              wo_05.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_ffffffffffffed94;
              wo_05.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffed90;
              wo_05.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed98;
              TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF>::Sample_f
                        ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF> *)
                         CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),wo_05,
                         in_stack_ffffffffffffed6c,(Point2f)in_stack_ffffffffffffed78,
                         in_stack_ffffffffffffed68,in_stack_ffffffffffffed64);
              bVar71 = pstd::optional::operator_cast_to_bool(local_69c);
              if (bVar71) {
                pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x70407d)
                ;
                bVar71 = SampledSpectrum::operator_cast_to_bool
                                   ((SampledSpectrum *)
                                    CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
                if (!bVar71) goto LAB_0070410c;
                pBVar72 = pstd::optional<pbrt::BSDFSample>::operator->
                                    ((optional<pbrt::BSDFSample> *)0x7040b7);
                fVar76 = pBVar72->pdf;
                auVar79 = ZEXT464((uint)fVar76);
                auVar91 = ZEXT1664((undefined1  [16])0x0);
                if ((fVar76 == 0.0) && (!NAN(fVar76))) goto LAB_0070410c;
                pBVar72 = pstd::optional<pbrt::BSDFSample>::operator->
                                    ((optional<pbrt::BSDFSample> *)0x7040e9);
                fVar76 = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                auVar79 = ZEXT464((uint)fVar76);
                auVar91 = ZEXT1664((undefined1  [16])0x0);
                if ((fVar76 == 0.0) && (!NAN(fVar76))) goto LAB_0070410c;
                pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x70414f)
                ;
                pBVar72 = pstd::optional<pbrt::BSDFSample>::operator->
                                    ((optional<pbrt::BSDFSample> *)0x704176);
                local_708 = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                local_710._0_4_ = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.x;
                local_710._4_4_ = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.y;
                uVar85 = 0;
                w_06.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_ffffffffffffed20;
                w_06.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffed1c;
                w_06.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffed24;
                local_700 = local_710;
                local_6f8 = local_708;
                AbsCosTheta(w_06);
                uVar84 = 0;
                SVar96 = SampledSpectrum::operator*
                                   ((SampledSpectrum *)
                                    CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                                    in_stack_ffffffffffffed1c);
                auVar36._8_8_ = uVar85;
                auVar36._0_8_ = SVar96.values.values._8_8_;
                auVar37._8_8_ = uVar84;
                auVar37._0_8_ = SVar96.values.values._0_8_;
                local_6f0 = vmovlpd_avx(auVar37);
                local_6e8 = vmovlpd_avx(auVar36);
                pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x704239)
                ;
                uVar85 = 0;
                SVar96 = SampledSpectrum::operator/
                                   ((SampledSpectrum *)
                                    CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
                                    in_stack_ffffffffffffed14);
                auVar34._8_8_ = uVar84;
                auVar34._0_8_ = SVar96.values.values._8_8_;
                auVar79 = ZEXT1664(auVar34);
                auVar35._8_8_ = uVar85;
                auVar35._0_8_ = SVar96.values.values._0_8_;
                auVar91 = ZEXT1664(auVar35);
                local_6e0 = vmovlpd_avx(auVar35);
                local_6d8 = vmovlpd_avx(auVar34);
                SampledSpectrum::operator*=
                          ((SampledSpectrum *)
                           CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                           (SampledSpectrum *)
                           CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
                pBVar72 = pstd::optional<pbrt::BSDFSample>::operator->
                                    ((optional<pbrt::BSDFSample> *)0x7042b9);
                local_370._0_4_ = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.x;
                local_370._4_4_ = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.y;
                local_368 = (pBVar72->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                local_2c8 = 0;
              }
              else {
LAB_0070410c:
                local_2c8 = 5;
              }
              pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)0x7042f9);
            }
            if (local_2c8 != 0) break;
          }
LAB_007052c5:
        }
        local_2c8 = 0;
      }
      else {
LAB_00702ad8:
        local_2c8 = 4;
      }
      pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)0x7052f3);
    }
    else {
LAB_007028c8:
      local_2c8 = 4;
    }
    pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)0x705300);
    local_25c = local_25c + 1;
  } while( true );
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        SampledSpectrum f(0.);
        // Estimate _LayeredBxDF_ value _f_ using random sampling
        // Set _wo_ and _wi_ for layered BSDF evaluation
        if (twoSided && wo.z < 0) {
            wo = -wo;
            wi = -wi;
        }

        // Determine entrance interface for layered BSDF
        TopOrBottomBxDF<TopBxDF, BottomBxDF> enterInterface;
        bool enteredTop = twoSided || wo.z > 0;
        if (enteredTop)
            enterInterface = &top;
        else
            enterInterface = &bottom;

        // Determine exit interface and exit $z$ for layered BSDF
        TopOrBottomBxDF<TopBxDF, BottomBxDF> exitInterface, nonExitInterface;
        if (SameHemisphere(wo, wi) ^ enteredTop) {
            exitInterface = &bottom;
            nonExitInterface = &top;
        } else {
            exitInterface = &top;
            nonExitInterface = &bottom;
        }
        Float exitZ = (SameHemisphere(wo, wi) ^ enteredTop) ? 0 : thickness;

        // Account for reflection at the entrance interface
        if (SameHemisphere(wo, wi))
            f = nSamples * enterInterface.f(wo, wi, mode);

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        for (int s = 0; s < nSamples; ++s) {
            // Sample random walk through layers to estimate BSDF value
            // Sample transmission direction through entrance interface
            Float uc = r();
            pstd::optional<BSDFSample> wos = enterInterface.Sample_f(
                wo, uc, Point2f(r(), r()), mode, BxDFReflTransFlags::Transmission);
            if (!wos || !wos->f || wos->pdf == 0 || wos->wi.z == 0)
                continue;

            // Sample BSDF for virtual light from _wi_
            uc = r();
            pstd::optional<BSDFSample> wis = exitInterface.Sample_f(
                wi, uc, Point2f(r(), r()), !mode, BxDFReflTransFlags::Transmission);
            if (!wis || !wis->f || wis->pdf == 0 || wis->wi.z == 0)
                continue;

            // Declare state for random walk through BSDF layers
            SampledSpectrum beta = wos->f * AbsCosTheta(wos->wi) / wos->pdf;
            Float z = enteredTop ? thickness : 0;
            Vector3f w = wos->wi;
            HGPhaseFunction phase(g);

            for (int depth = 0; depth < maxDepth; ++depth) {
                // Sample next event for layered BSDF evaluation random walk
                PBRT_DBG("beta: %f %f %f %f, w: %f %f %f, f: %f %f %f %f\n", beta[0],
                         beta[1], beta[2], beta[3], w.x, w.y, w.z, f[0], f[1], f[2],
                         f[3]);
                // Possibly terminate layered BSDF random walk with Russian roulette
                if (depth > 3 && beta.MaxComponentValue() < 0.25f) {
                    Float q = std::max<Float>(0, 1 - beta.MaxComponentValue());
                    if (r() < q)
                        break;
                    beta /= 1 - q;
                    PBRT_DBG("After RR with q = %f, beta: %f %f %f %f\n", q, beta[0],
                             beta[1], beta[2], beta[3]);
                }

                // Account for media between layers and possibly scatter
                if (!albedo) {
                    // Advance to next layer boundary and update _beta_ for transmittance
                    z = (z == thickness) ? 0 : thickness;
                    beta *= Tr(thickness, w);

                } else {
                    // Sample medium scattering for layered BSDF evaluation
                    Float sigma_t = 1;
                    Float dz = SampleExponential(r(), sigma_t / std::abs(w.z));
                    Float zp = w.z > 0 ? (z + dz) : (z - dz);
                    DCHECK_RARE(1e-5, z == zp);
                    if (z == zp)
                        continue;
                    if (0 < zp && zp < thickness) {
                        // Handle scattering event in layered BSDF medium
                        // Account for scattering through _exitInterface_ using _wis_
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis->pdf, 1, phase.PDF(-w, -wis->wi));
                        f += beta * albedo * phase.p(-w, -wis->wi) * wt *
                             Tr(zp - exitZ, wis->wi) * wis->f / wis->pdf;

                        // Sample phase function and update layered path state
                        Point2f u{r(), r()};
                        pstd::optional<PhaseFunctionSample> ps = phase.Sample_p(-w, u);
                        if (!ps || ps->pdf == 0 || ps->wi.z == 0)
                            continue;
                        beta *= albedo * ps->p / ps->pdf;
                        w = ps->wi;
                        z = zp;

                        // Possibly account for scattering through _exitInterface_
                        if (((z < exitZ && w.z > 0) || (z > exitZ && w.z < 0)) &&
                            !IsSpecular(exitInterface.Flags())) {
                            // Account for scattering through _exitInterface_
                            SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                            if (fExit) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                Float wt = PowerHeuristic(1, ps->pdf, 1, exitPDF);
                                f += beta * Tr(zp - exitZ, ps->wi) * fExit * wt;
                            }
                        }

                        continue;
                    }
                    z = Clamp(zp, 0, thickness);
                }

                // Account for scattering at appropriate interface
                if (z == exitZ) {
                    // Account for reflection at _exitInterface_
                    Float uc = r();
                    pstd::optional<BSDFSample> bs = exitInterface.Sample_f(
                        -w, uc, Point2f(r(), r()), mode, BxDFReflTransFlags::Reflection);
                    if (!bs || !bs->f || bs->pdf == 0 || bs->wi.z == 0)
                        break;
                    beta *= bs->f * AbsCosTheta(bs->wi) / bs->pdf;
                    w = bs->wi;

                } else {
                    // Account for scattering at _nonExitInterface_
                    if (!IsSpecular(nonExitInterface.Flags())) {
                        // Add NEE contribution along presampled _wis_ direction
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis->pdf, 1,
                                                nonExitInterface.PDF(-w, -wis->wi, mode));
                        f += beta * nonExitInterface.f(-w, -wis->wi, mode) *
                             AbsCosTheta(wis->wi) * wt * Tr(thickness, wis->wi) * wis->f /
                             wis->pdf;
                    }
                    // Sample new direction using BSDF at _nonExitInterface_
                    Float uc = r();
                    Point2f u(r(), r());
                    pstd::optional<BSDFSample> bs = nonExitInterface.Sample_f(
                        -w, uc, u, mode, BxDFReflTransFlags::Reflection);
                    if (!bs || !bs->f || bs->pdf == 0 || bs->wi.z == 0)
                        break;
                    beta *= bs->f * AbsCosTheta(bs->wi) / bs->pdf;
                    w = bs->wi;

                    if (!IsSpecular(exitInterface.Flags())) {
                        // Add NEE contribution along direction from BSDF sample
                        SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                        if (fExit) {
                            Float wt = 1;
                            if (!IsSpecular(nonExitInterface.Flags())) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                wt = PowerHeuristic(1, bs->pdf, 1, exitPDF);
                            }
                            f += beta * Tr(thickness, bs->wi) * fExit * wt;
                        }
                    }
                }
            }
        }

        return f / nSamples;
    }